

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_curves.c
# Opt level: O3

int ecp_mod_p192(mbedtls_mpi *N)

{
  size_t sVar1;
  ulong *puVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  ulong *puVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  
  iVar6 = mbedtls_mpi_grow(N,6);
  if (iVar6 == 0) {
    sVar1 = N->n;
    puVar2 = N->p;
    uVar12 = puVar2[3];
    uVar3 = puVar2[4];
    uVar11 = uVar12 + *puVar2;
    uVar4 = puVar2[5];
    uVar8 = (ulong)CARRY8(uVar11,uVar4);
    uVar14 = (ulong)CARRY8(*puVar2,uVar12);
    uVar13 = puVar2[1];
    uVar5 = uVar8 + puVar2[1];
    uVar9 = uVar5 + uVar14;
    uVar10 = uVar9 + uVar12;
    *puVar2 = uVar11 + uVar4;
    uVar11 = uVar10 + uVar3;
    puVar2[1] = uVar11 + uVar4;
    uVar12 = (ulong)CARRY8(uVar10,uVar3) +
             (ulong)CARRY8(uVar9,uVar12) + (ulong)(CARRY8(uVar8,uVar13) || CARRY8(uVar5,uVar14)) +
             (ulong)CARRY8(uVar11,uVar4);
    uVar11 = puVar2[2];
    uVar13 = uVar12 + puVar2[2];
    uVar14 = uVar13 + uVar3;
    puVar2[2] = uVar14 + uVar4;
    puVar2[3] = (ulong)CARRY8(uVar13,uVar3) + (ulong)CARRY8(uVar12,uVar11) +
                (ulong)CARRY8(uVar14,uVar4);
    if (4 < (long)sVar1) {
      puVar7 = puVar2 + 5;
      if (puVar2 + 5 < puVar2 + sVar1) {
        puVar7 = puVar2 + sVar1;
      }
      memset(puVar2 + 4,0,((long)puVar7 + (-0x21 - (long)puVar2) & 0xfffffffffffffff8U) + 8);
    }
  }
  return iVar6;
}

Assistant:

static int ecp_mod_p192( mbedtls_mpi *N )
{
    int ret;
    mbedtls_mpi_uint c = 0;
    mbedtls_mpi_uint *p, *end;

    /* Make sure we have enough blocks so that A(5) is legal */
    MBEDTLS_MPI_CHK( mbedtls_mpi_grow( N, 6 * WIDTH ) );

    p = N->p;
    end = p + N->n;

    ADD( 3 ); ADD( 5 );             NEXT; // A0 += A3 + A5
    ADD( 3 ); ADD( 4 ); ADD( 5 );   NEXT; // A1 += A3 + A4 + A5
    ADD( 4 ); ADD( 5 );             LAST; // A2 += A4 + A5

cleanup:
    return( ret );
}